

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall duckdb::OperatorProfiler::Flush(OperatorProfiler *this,PhysicalOperator *phys_op)

{
  __node_base_ptr p_Var1;
  __hash_code __code;
  _Hash_node_base *p_Var2;
  key_type local_40 [2];
  
  local_40[0]._M_data = phys_op;
  p_Var1 = ::std::
           _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->operator_infos)._M_h,
                      (ulong)phys_op % (this->operator_infos)._M_h._M_bucket_count,local_40,
                      (__hash_code)phys_op);
  if ((p_Var1 != (__node_base_ptr)0x0) && (p_Var1->_M_nxt != (_Hash_node_base *)0x0)) {
    p_Var2 = (_Hash_node_base *)0x0;
    local_40[0]._M_data = phys_op;
    p_Var1 = ::std::
             _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->operator_infos)._M_h,
                        (ulong)phys_op % (this->operator_infos)._M_h._M_bucket_count,local_40,
                        (__hash_code)phys_op);
    if (p_Var1 != (__node_base_ptr)0x0) {
      p_Var2 = p_Var1->_M_nxt;
    }
    (*phys_op->_vptr_PhysicalOperator[2])((string *)local_40,phys_op);
    ::std::__cxx11::string::operator=((string *)(p_Var2 + 2),(string *)local_40);
    if (local_40[0]._M_data != (PhysicalOperator *)&stack0xffffffffffffffd0) {
      operator_delete(local_40[0]._M_data);
    }
  }
  return;
}

Assistant:

void OperatorProfiler::Flush(const PhysicalOperator &phys_op) {
	auto entry = operator_infos.find(phys_op);
	if (entry == operator_infos.end()) {
		return;
	}

	auto &info = operator_infos.find(phys_op)->second;
	info.name = phys_op.GetName();
}